

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall
pbrt::ParsedScene::Camera(ParsedScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  FileLoc loc_00;
  mapped_type *pmVar1;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  ParameterDictionary dict;
  TransformSet cameraFromWorld;
  TransformSet worldFromCamera;
  CameraTransform cameraTransform;
  ParameterDictionary local_a98;
  ParameterDictionary local_a30;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_9c8;
  TransformSet local_968;
  undefined1 local_868 [984];
  _Alloc_hider local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  TransformSet local_468;
  undefined1 local_368 [704];
  ParsedParameter *pPStack_a8;
  ParsedParameter *pPStack_a0;
  ParsedParameter *pPStack_98;
  ParsedParameter *pPStack_90;
  ParsedParameter *pPStack_88;
  size_t sStack_80;
  size_t sStack_78;
  pointer local_70;
  size_type sStack_68;
  size_type sStack_60;
  Float aFStack_58 [2];
  memory_resource *pmStack_50;
  ParsedParameter **ppPStack_48;
  ParsedParameter *pPStack_40;
  ParsedParameter *pPStack_38;
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_9c8,in_RDX);
  ParameterDictionary::ParameterDictionary(&local_a30,&local_9c8,(this->graphicsState).colorSpace);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_9c8);
  if (this->currentBlock != WorldBlock) {
    local_968.t[0].m.m[0]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].m.m[0];
    local_968.t[0].m.m[0]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].m.m[0] + 2);
    local_968.t[0].m.m[1]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].m.m[1];
    local_968.t[0].m.m[1]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].m.m[1] + 2);
    local_968.t[0].m.m[2]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].m.m[2];
    local_968.t[0].m.m[2]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].m.m[2] + 2);
    local_968.t[0].m.m[3]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].m.m[3];
    local_968.t[0].m.m[3]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].m.m[3] + 2);
    local_968.t[0].mInv.m[0]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].mInv.m[0];
    local_968.t[0].mInv.m[0]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].mInv.m[0] + 2);
    local_968.t[0].mInv.m[1]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].mInv.m[1];
    local_968.t[0].mInv.m[1]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].mInv.m[1] + 2);
    local_968.t[0].mInv.m[2]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].mInv.m[2];
    local_968.t[0].mInv.m[2]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].mInv.m[2] + 2);
    local_968.t[0].mInv.m[3]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].mInv.m[3];
    local_968.t[0].mInv.m[3]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].mInv.m[3] + 2);
    local_968.t[1].m.m[0]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].m.m[0];
    local_968.t[1].m.m[0]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].m.m[0] + 2);
    local_968.t[1].m.m[1]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].m.m[1];
    local_968.t[1].m.m[1]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].m.m[1] + 2);
    local_968.t[1].m.m[2]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].m.m[2];
    local_968.t[1].m.m[2]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].m.m[2] + 2);
    local_968.t[1].m.m[3]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].m.m[3];
    local_968.t[1].m.m[3]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].m.m[3] + 2);
    local_968.t[1].mInv.m[0]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].mInv.m[0];
    local_968.t[1].mInv.m[0]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].mInv.m[0] + 2);
    local_968.t[1].mInv.m[1]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].mInv.m[1];
    local_968.t[1].mInv.m[1]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].mInv.m[1] + 2);
    local_968.t[1].mInv.m[2]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].mInv.m[2];
    local_968.t[1].mInv.m[2]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].mInv.m[2] + 2);
    local_968.t[1].mInv.m[3]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].mInv.m[3];
    local_968.t[1].mInv.m[3]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].mInv.m[3] + 2);
    Inverse(&local_468,&(this->graphicsState).ctm);
    Inverse((TransformSet *)local_868,&local_968);
    local_368._0_8_ = local_368 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"camera","");
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
             ::operator[](&this->namedCoordinateSystems,(key_type *)local_368);
    *(undefined8 *)pmVar1->t[1].mInv.m[0] = local_868._192_8_;
    *(undefined8 *)(pmVar1->t[1].mInv.m[0] + 2) = local_868._200_8_;
    *(undefined8 *)pmVar1->t[1].mInv.m[1] = local_868._208_8_;
    *(undefined8 *)(pmVar1->t[1].mInv.m[1] + 2) = local_868._216_8_;
    *(undefined8 *)pmVar1->t[1].mInv.m[2] = local_868._224_8_;
    *(undefined8 *)(pmVar1->t[1].mInv.m[2] + 2) = local_868._232_8_;
    *(undefined8 *)pmVar1->t[1].mInv.m[3] = local_868._240_8_;
    *(undefined8 *)(pmVar1->t[1].mInv.m[3] + 2) = local_868._248_8_;
    *(undefined8 *)pmVar1->t[1].m.m[0] = local_868._128_8_;
    *(undefined8 *)(pmVar1->t[1].m.m[0] + 2) = local_868._136_8_;
    *(undefined8 *)pmVar1->t[1].m.m[1] = local_868._144_8_;
    *(undefined8 *)(pmVar1->t[1].m.m[1] + 2) = local_868._152_8_;
    *(undefined8 *)pmVar1->t[1].m.m[2] = local_868._160_8_;
    *(undefined8 *)(pmVar1->t[1].m.m[2] + 2) = local_868._168_8_;
    *(undefined8 *)pmVar1->t[1].m.m[3] = local_868._176_8_;
    *(undefined8 *)(pmVar1->t[1].m.m[3] + 2) = local_868._184_8_;
    *(undefined8 *)pmVar1->t[0].mInv.m[0] = local_868._64_8_;
    *(undefined8 *)(pmVar1->t[0].mInv.m[0] + 2) = local_868._72_8_;
    *(undefined8 *)pmVar1->t[0].mInv.m[1] = local_868._80_8_;
    *(undefined8 *)(pmVar1->t[0].mInv.m[1] + 2) = local_868._88_8_;
    *(undefined8 *)pmVar1->t[0].mInv.m[2] = local_868._96_8_;
    *(undefined8 *)(pmVar1->t[0].mInv.m[2] + 2) = local_868._104_8_;
    *(undefined8 *)pmVar1->t[0].mInv.m[3] = local_868._112_8_;
    *(undefined8 *)(pmVar1->t[0].mInv.m[3] + 2) = local_868._120_8_;
    *(undefined8 *)pmVar1->t[0].m.m[0] = local_868._0_8_;
    *(undefined8 *)(pmVar1->t[0].m.m[0] + 2) = local_868._8_8_;
    *(undefined8 *)pmVar1->t[0].m.m[1] = local_868._16_8_;
    *(undefined8 *)(pmVar1->t[0].m.m[1] + 2) = local_868._24_8_;
    *(undefined8 *)pmVar1->t[0].m.m[2] = local_868._32_8_;
    *(undefined8 *)(pmVar1->t[0].m.m[2] + 2) = local_868._40_8_;
    *(undefined8 *)pmVar1->t[0].m.m[3] = local_868._48_8_;
    *(undefined8 *)(pmVar1->t[0].m.m[3] + 2) = local_868._56_8_;
    if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
      operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
    }
    AnimatedTransform::AnimatedTransform
              ((AnimatedTransform *)local_868,local_468.t,(this->graphicsState).transformStartTime,
               local_468.t + 1,(this->graphicsState).transformEndTime);
    CameraTransform::CameraTransform((CameraTransform *)local_368,(AnimatedTransform *)local_868);
    local_868._0_8_ = local_70;
    local_868._8_8_ = sStack_68;
    local_868._16_8_ = sStack_60;
    local_868._24_4_ = aFStack_58[0];
    local_868._28_4_ = aFStack_58[1];
    local_868._32_8_ = pmStack_50;
    local_868._40_8_ = ppPStack_48;
    local_868._48_8_ = pPStack_40;
    local_868._56_8_ = pPStack_38;
    local_868._64_8_ = local_368._696_8_;
    local_868._72_8_ = pPStack_a8;
    local_868._80_8_ = pPStack_a0;
    local_868._88_8_ = pPStack_98;
    local_868._96_8_ = pPStack_90;
    local_868._104_8_ = pPStack_88;
    local_868._112_8_ = sStack_80;
    local_868._120_8_ = sStack_78;
    *(undefined8 *)(this->renderFromWorld).mInv.m[0] = local_368._696_8_;
    *(ParsedParameter **)((this->renderFromWorld).mInv.m[0] + 2) = pPStack_a8;
    *(ParsedParameter **)(this->renderFromWorld).mInv.m[1] = pPStack_a0;
    *(ParsedParameter **)((this->renderFromWorld).mInv.m[1] + 2) = pPStack_98;
    *(ParsedParameter **)(this->renderFromWorld).mInv.m[2] = pPStack_90;
    *(ParsedParameter **)((this->renderFromWorld).mInv.m[2] + 2) = pPStack_88;
    *(size_t *)(this->renderFromWorld).mInv.m[3] = sStack_80;
    *(size_t *)((this->renderFromWorld).mInv.m[3] + 2) = sStack_78;
    *(pointer *)(this->renderFromWorld).m.m[0] = local_70;
    *(size_type *)((this->renderFromWorld).m.m[0] + 2) = sStack_68;
    *(size_type *)(this->renderFromWorld).m.m[1] = sStack_60;
    *(Float (*) [2])((this->renderFromWorld).m.m[1] + 2) = aFStack_58;
    *(memory_resource **)(this->renderFromWorld).m.m[2] = pmStack_50;
    *(ParsedParameter ***)((this->renderFromWorld).m.m[2] + 2) = ppPStack_48;
    *(ParsedParameter **)(this->renderFromWorld).m.m[3] = pPStack_40;
    *(ParsedParameter **)((this->renderFromWorld).m.m[3] + 2) = pPStack_38;
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::InlinedVector(&local_a98.params,&local_a30.params);
    local_a98.colorSpace = local_a30.colorSpace;
    loc_00.filename._M_str = (char *)params.ptr;
    loc_00.filename._M_len = (size_t)params.alloc.memoryResource;
    loc_00._16_8_ = params.field_2.fixed[0];
    CameraSceneEntity::CameraSceneEntity
              ((CameraSceneEntity *)local_868,name,&local_a98,loc_00,(CameraTransform *)local_368,
               &(this->graphicsState).currentOutsideMedium);
    std::__cxx11::string::operator=((string *)&this->camera,(string *)local_868);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::operator=(&(this->camera).super_SceneEntity.parameters.params,
                (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 *)(local_868 + 0x20));
    (this->camera).super_SceneEntity.parameters.colorSpace = (RGBColorSpace *)local_868._128_8_;
    (this->camera).super_SceneEntity.loc.filename._M_len = local_868._136_8_;
    (this->camera).super_SceneEntity.loc.filename._M_str = (char *)local_868._144_8_;
    (this->camera).super_SceneEntity.loc.line = local_868._152_4_;
    (this->camera).super_SceneEntity.loc.column = local_868._156_4_;
    memcpy(&(this->camera).cameraTransform,local_868 + 0xa0,0x338);
    std::__cxx11::string::operator=((string *)&(this->camera).medium,(string *)&local_490);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_p != &local_480) {
      operator_delete(local_490._M_p,local_480._M_allocated_capacity + 1);
    }
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                      *)(local_868 + 0x20));
    if ((undefined1 *)local_868._0_8_ != local_868 + 0x10) {
      operator_delete((void *)local_868._0_8_,local_868._16_8_ + 1);
    }
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_a98.params);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_a30.params);
    return;
  }
  ErrorExit<char_const(&)[7]>
            ((FileLoc *)&params,"Options cannot be set inside world block; \"%s\" is not allowed.",
             (char (*) [7])0x2cbe765);
}

Assistant:

void ParsedScene::Camera(const std::string &name, ParsedParameterVector params,
                         FileLoc loc) {
    ParameterDictionary dict(std::move(params), graphicsState.colorSpace);

    VERIFY_OPTIONS("Camera");

    TransformSet cameraFromWorld = graphicsState.ctm;
    TransformSet worldFromCamera = Inverse(graphicsState.ctm);
    namedCoordinateSystems["camera"] = Inverse(cameraFromWorld);

    CameraTransform cameraTransform(
        AnimatedTransform(worldFromCamera[0], graphicsState.transformStartTime,
                          worldFromCamera[1], graphicsState.transformEndTime));
    renderFromWorld = cameraTransform.RenderFromWorld();

    camera = CameraSceneEntity(name, std::move(dict), loc, cameraTransform,
                               graphicsState.currentOutsideMedium);
}